

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int SaveEXRToMemory(float *data,int width,int height,int components,int save_as_fp16,uchar **outbuf,
                   char **err)

{
  void *pvVar1;
  long *plVar2;
  char *pcVar3;
  EXRChannelInfo *__dest;
  long lVar4;
  int *piVar5;
  size_t sVar6;
  undefined8 uVar7;
  size_type __new_size;
  size_type sVar8;
  int iVar9;
  float *pfVar10;
  vector<float,_std::allocator<float>_> images [4];
  float *image_ptr [4];
  uchar *mem_buf;
  EXRImage image;
  EXRHeader header;
  vector<float,_std::allocator<float>_> local_288;
  vector<float,_std::allocator<float>_> vStack_270;
  vector<float,_std::allocator<float>_> local_258;
  vector<float,_std::allocator<float>_> vStack_240;
  pointer local_228;
  pointer pfStack_220;
  pointer local_218;
  pointer pfStack_210;
  uchar **local_208;
  uchar *local_200;
  EXRImage local_1f8;
  EXRHeader *local_1c0;
  undefined1 local_1b8 [104];
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int local_13c;
  int *local_138 [33];
  
  if (((uint)components < 5) && ((0x1aU >> (components & 0x1fU) & 1) != 0)) {
    local_208 = outbuf;
    memset(local_1b8,0,0x188);
    local_13c = 3;
    if (width < 0x10) {
      local_13c = (uint)(0xf < height) * 3;
    }
    iVar9 = height * width;
    local_1f8.width = 0;
    local_1f8.height = 0;
    local_1f8.level_x = 0;
    local_1f8.level_y = 0;
    local_1f8.images = (uchar **)0x0;
    local_1f8.tiles = (EXRTile *)0x0;
    local_1f8.next_level = (TEXRImage *)0x0;
    local_1f8.num_tiles = 0;
    local_1f8.num_channels = components;
    vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __new_size = (size_type)iVar9;
    if (components == 1) {
      std::vector<float,_std::allocator<float>_>::resize(&local_288,__new_size);
      memcpy(local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,data,__new_size << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize(&local_288,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(&vStack_270,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(&local_258,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(&vStack_240,__new_size);
      if (components == 4) {
        if (iVar9 != 0) {
          pfVar10 = data + 3;
          sVar8 = 0;
          do {
            local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[sVar8] = pfVar10[-3];
            vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[sVar8] = pfVar10[-2];
            local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[sVar8] = pfVar10[-1];
            vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[sVar8] = *pfVar10;
            sVar8 = sVar8 + 1;
            pfVar10 = pfVar10 + 4;
          } while (__new_size != sVar8);
        }
      }
      else if (iVar9 != 0) {
        pfVar10 = data + 2;
        sVar8 = 0;
        do {
          local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar8] = pfVar10[-2];
          vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar8] = pfVar10[-1];
          local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar8] = *pfVar10;
          sVar8 = sVar8 + 1;
          pfVar10 = pfVar10 + (uint)components;
        } while (__new_size != sVar8);
      }
    }
    local_218 = (pointer)0x0;
    pfStack_210 = (pointer)0x0;
    local_228 = (pointer)0x0;
    pfStack_220 = (pointer)0x0;
    if (components == 4) {
      if (((vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) ||
          (local_228 = vStack_240.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
          local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start)) ||
         ((pfStack_220 = local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,
          vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start ||
          (local_218 = vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
          local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start)))) {
LAB_0010d8e4:
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)local_138);
        _Unwind_Resume(uVar7);
      }
      pfStack_210 = local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    else if (components == 3) {
      if (((local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) ||
          (local_228 = local_258.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
          vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start)) ||
         (pfStack_220 = vStack_270.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
         local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish ==
         local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_start)) goto LAB_0010d8e4;
      local_218 = local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    else if (components == 1) {
      if (local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) goto LAB_0010d8e4;
      local_228 = local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_1f8.images = (uchar **)&local_228;
    local_1f8.height = height;
    local_1f8.width = width;
    local_140 = components;
    __dest = (EXRChannelInfo *)malloc((ulong)(uint)(components * 0x110));
    local_150 = __dest;
    if (components == 4) {
      strncpy((char *)__dest,"A",0xff);
      strncpy(__dest[1].name,"B",0xff);
      strncpy(__dest[2].name,"G",0xff);
      strncpy(__dest[3].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      __dest[2].name[1] = '\0';
      lVar4 = 0x331;
    }
    else if (components == 3) {
      strncpy((char *)__dest,"B",0xff);
      strncpy(__dest[1].name,"G",0xff);
      strncpy(__dest[2].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      lVar4 = 0x221;
    }
    else {
      strncpy((char *)__dest,"A",0xff);
      lVar4 = 1;
    }
    __dest->name[lVar4] = '\0';
    lVar4 = (long)local_140;
    piVar5 = (int *)malloc(lVar4 << 2);
    local_148 = piVar5;
    local_138[0] = (int *)malloc(lVar4 << 2);
    if (0 < (long)local_140) {
      lVar4 = 0;
      do {
        piVar5[lVar4] = 2;
        local_138[0][lVar4] = (save_as_fp16 < 1) + 1;
        lVar4 = lVar4 + 1;
      } while (local_140 != lVar4);
    }
    local_1c0 = (EXRHeader *)local_1b8;
    sVar6 = tinyexr::SaveEXRNPartImageToMemory(&local_1f8,&local_1c0,1,&local_200,err);
    if (sVar6 == 0) {
      sVar6 = 0xfffffff4;
    }
    else {
      free(local_150);
      free(local_148);
      free(local_138[0]);
      if (sVar6 >> 0x1f == 0) {
        *local_208 = local_200;
      }
      else {
        free(local_200);
        sVar6 = 0xfffffff2;
      }
    }
    iVar9 = (int)sVar6;
    lVar4 = 0x48;
    do {
      pvVar1 = *(void **)((long)&local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1);
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"Unsupported component value : ",0x1e);
    plVar2 = (long *)std::ostream::operator<<((ostream *)(local_1b8 + 0x10),components);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      *err = pcVar3;
    }
    if ((pointer *)
        local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage) {
      operator_delete(local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)local_138);
    iVar9 = -3;
  }
  return iVar9;
}

Assistant:

int SaveEXRToMemory(const float *data, int width, int height, int components,
            const int save_as_fp16, unsigned char **outbuf, const char **err) {

  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];

  if (components == 1) {
    images[0].resize(static_cast<size_t>(width * height));
    memcpy(images[0].data(), data, sizeof(float) * size_t(width * height));
  } else {
    images[0].resize(static_cast<size_t>(width * height));
    images[1].resize(static_cast<size_t>(width * height));
    images[2].resize(static_cast<size_t>(width * height));
    images[3].resize(static_cast<size_t>(width * height));

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    if (components == 4) {
        for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
          images[0][i] = data[static_cast<size_t>(components) * i + 0];
          images[1][i] = data[static_cast<size_t>(components) * i + 1];
          images[2][i] = data[static_cast<size_t>(components) * i + 2];
          images[3][i] = data[static_cast<size_t>(components) * i + 3];
        }
    } else {
       for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
          images[0][i] = data[static_cast<size_t>(components) * i + 0];
          images[1][i] = data[static_cast<size_t>(components) * i + 1];
          images[2][i] = data[static_cast<size_t>(components) * i + 2];
        }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }


  unsigned char *mem_buf;
  size_t mem_size = SaveEXRImageToMemory(&image, &header, &mem_buf, err);

  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  if (mem_size > size_t(std::numeric_limits<int>::max())) {
    free(mem_buf);
    return TINYEXR_ERROR_DATA_TOO_LARGE;
  }

  (*outbuf) = mem_buf;

  return int(mem_size);
}